

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

int __thiscall
QProxyStyle::pixelMetric(QProxyStyle *this,PixelMetric metric,QStyleOption *option,QWidget *widget)

{
  int iVar1;
  QProxyStylePrivate *pQVar2;
  QStyle *pQVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_R8;
  undefined8 in_R9;
  QProxyStylePrivate *d;
  
  pQVar2 = d_func((QProxyStyle *)0x409485);
  QProxyStylePrivate::ensureBaseStyle((QProxyStylePrivate *)widget);
  pQVar3 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x4094a2);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,in_ESI,in_RDX,in_RCX,in_R8,in_R9,pQVar2);
  return iVar1;
}

Assistant:

int QProxyStyle::pixelMetric(PixelMetric metric, const QStyleOption *option, const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->pixelMetric(metric, option, widget);
}